

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O0

void __thiscall
NshCmdArrayLexicographicSort_Success_Test::NshCmdArrayLexicographicSort_Success_Test
          (NshCmdArrayLexicographicSort_Success_Test *this)

{
  NshCmdArrayLexicographicSort_Success_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__NshCmdArrayLexicographicSort_Success_Test_001c8380;
  return;
}

Assistant:

TEST(NshCmdArrayLexicographicSort, Success)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd3_test", &cmd3), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd1_test", &cmd1), NSH_STATUS_OK);
    ASSERT_EQ(nsh_cmd_array_register(&cmds, "cmd2_test", &cmd2), NSH_STATUS_OK);

    auto status = nsh_cmd_array_lexicographic_sort(&cmds);
    ASSERT_EQ(status, NSH_STATUS_OK);

    ASSERT_STREQ(cmds.array[0].name, "cmd1_test");
    ASSERT_EQ(cmds.array[0].handler, &cmd1);
    ASSERT_STREQ(cmds.array[1].name, "cmd2_test");
    ASSERT_EQ(cmds.array[1].handler, &cmd2);
    ASSERT_STREQ(cmds.array[2].name, "cmd3_test");
    ASSERT_EQ(cmds.array[2].handler, &cmd3);
}